

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

void __thiscall
diligent_spirv_cross::Compiler::PhysicalStorageBufferPointerHandler::setup_meta_chain
          (PhysicalStorageBufferPointerHandler *this,uint32_t type_id,uint32_t var_id)

{
  bool bVar1;
  uint32_t uVar2;
  mapped_type *pmVar3;
  mapped_type *ppPVar4;
  SPIRType *pSVar5;
  uint32_t local_20;
  uint32_t local_1c;
  
  local_20 = type_id;
  local_1c = var_id;
  bVar1 = type_is_bda_block_entry(this,type_id);
  if (bVar1) {
    pmVar3 = ::std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_diligent_spirv_cross::Compiler::PhysicalBlockMeta>,_std::allocator<std::pair<const_unsigned_int,_diligent_spirv_cross::Compiler::PhysicalBlockMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_diligent_spirv_cross::Compiler::PhysicalBlockMeta>,_std::allocator<std::pair<const_unsigned_int,_diligent_spirv_cross::Compiler::PhysicalBlockMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->physical_block_type_meta,&local_20);
    ppPVar4 = ::std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_diligent_spirv_cross::Compiler::PhysicalBlockMeta_*>,_std::allocator<std::pair<const_unsigned_int,_diligent_spirv_cross::Compiler::PhysicalBlockMeta_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_diligent_spirv_cross::Compiler::PhysicalBlockMeta_*>,_std::allocator<std::pair<const_unsigned_int,_diligent_spirv_cross::Compiler::PhysicalBlockMeta_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->access_chain_to_physical_block,&local_1c);
    *ppPVar4 = pmVar3;
    pSVar5 = get<diligent_spirv_cross::SPIRType>(this->compiler,local_20);
    bVar1 = is_physical_pointer_to_buffer_block(this->compiler,pSVar5);
    if (!bVar1) {
      ::std::__detail::
      _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)&this->non_block_types,&local_20);
    }
    if (pmVar3->alignment == 0) {
      pSVar5 = get_pointee_type(this->compiler,pSVar5);
      uVar2 = get_minimum_scalar_alignment(this,pSVar5);
      pmVar3->alignment = uVar2;
    }
  }
  return;
}

Assistant:

void Compiler::PhysicalStorageBufferPointerHandler::setup_meta_chain(uint32_t type_id, uint32_t var_id)
{
	if (type_is_bda_block_entry(type_id))
	{
		auto &meta = physical_block_type_meta[type_id];
		access_chain_to_physical_block[var_id] = &meta;

		auto &type = compiler.get<SPIRType>(type_id);

		if (!compiler.is_physical_pointer_to_buffer_block(type))
			non_block_types.insert(type_id);

		if (meta.alignment == 0)
			meta.alignment = get_minimum_scalar_alignment(compiler.get_pointee_type(type));
	}
}